

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O0

const_iterator __thiscall VarnodeBank::beginDef(VarnodeBank *this,uint4 fl,Address *addr)

{
  LowlevelError *this_00;
  key_type local_80 [2];
  key_type local_70 [2];
  undefined1 local_5d;
  allocator local_49;
  string local_48 [32];
  Address *local_28;
  Address *addr_local;
  VarnodeBank *pVStack_18;
  uint4 fl_local;
  VarnodeBank *this_local;
  const_iterator iter;
  
  local_28 = addr;
  addr_local._4_4_ = fl;
  pVStack_18 = this;
  std::_Rb_tree_const_iterator<Varnode_*>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<Varnode_*> *)&this_local);
  if (addr_local._4_4_ == 0x10) {
    local_5d = 1;
    this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Cannot get contiguous written AND addressed",&local_49);
    LowlevelError::LowlevelError(this_00,(string *)local_48);
    local_5d = 0;
    __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  if (addr_local._4_4_ == 8) {
    Address::operator=(&(this->searchvn).loc,local_28);
    local_70[0] = &this->searchvn;
    this_local = (VarnodeBank *)
                 std::set<Varnode_*,_VarnodeCompareDefLoc,_std::allocator<Varnode_*>_>::lower_bound
                           (&this->def_tree,local_70);
  }
  else {
    Address::operator=(&(this->searchvn).loc,local_28);
    (this->searchvn).flags = 0;
    local_80[0] = &this->searchvn;
    this_local = (VarnodeBank *)
                 std::set<Varnode_*,_VarnodeCompareDefLoc,_std::allocator<Varnode_*>_>::upper_bound
                           (&this->def_tree,local_80);
    (this->searchvn).flags = 8;
  }
  return (const_iterator)(_Base_ptr)this_local;
}

Assistant:

VarnodeDefSet::const_iterator VarnodeBank::beginDef(uint4 fl,const Address &addr) const

{				// Get varnodes with addr and with definition type
  VarnodeDefSet::const_iterator iter;

  if (fl == Varnode::written)
    throw LowlevelError("Cannot get contiguous written AND addressed");
  else if (fl == Varnode::input) {
    searchvn.loc = addr;
    iter = def_tree.lower_bound(&searchvn);
    return iter;
  }

  // Find the start of the frees with a given address
  searchvn.loc = addr;
  searchvn.flags = 0;
				// Since a size 0 object shouldn't exist, an upper bound
				// should bump up to first free of addr with non-zero size
  iter = def_tree.upper_bound(&searchvn);
  searchvn.flags = Varnode::input; // Reset flags
  return iter;
}